

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Watcher.cpp
# Opt level: O1

void __thiscall efsw::Watcher::Watcher(Watcher *this)

{
  this->_vptr_Watcher = (_func_int **)&PTR__Watcher_00128c80;
  this->ID = 0;
  (this->Directory)._M_dataplus._M_p = (pointer)&(this->Directory).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->Directory,"");
  this->Listener = (FileWatchListener *)0x0;
  this->Recursive = false;
  (this->OldFileName)._M_dataplus._M_p = (pointer)&(this->OldFileName).field_2;
  (this->OldFileName)._M_string_length = 0;
  (this->OldFileName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Watcher::Watcher() :
	ID(0),
	Directory(""),
	Listener(NULL),
	Recursive(false)
{
}